

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

int xmlShellWrite(xmlShellCtxtPtr ctxt,char *filename,xmlNodePtr node,xmlNodePtr node2)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  FILE *__stream;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  FILE *f;
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *filename_local;
  xmlShellCtxtPtr ctxt_local;
  
  if (node == (xmlNodePtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else if ((filename == (char *)0x0) || (*filename == '\0')) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (node->type == XML_DOCUMENT_NODE) {
      iVar2 = xmlSaveFile(filename,ctxt->doc);
      if (iVar2 < -1) {
        pp_Var3 = __xmlGenericError();
        p_Var1 = *pp_Var3;
        ppvVar4 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar4,"Failed to write to %s\n",filename);
        return -1;
      }
    }
    else if (node->type == XML_HTML_DOCUMENT_NODE) {
      iVar2 = htmlSaveFile(filename,ctxt->doc);
      if (iVar2 < 0) {
        pp_Var3 = __xmlGenericError();
        p_Var1 = *pp_Var3;
        ppvVar4 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar4,"Failed to write to %s\n",filename);
        return -1;
      }
    }
    else {
      __stream = fopen64(filename,"w");
      if (__stream == (FILE *)0x0) {
        pp_Var3 = __xmlGenericError();
        p_Var1 = *pp_Var3;
        ppvVar4 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar4,"Failed to write to %s\n",filename);
        return -1;
      }
      xmlElemDump((FILE *)__stream,ctxt->doc,node);
      fclose(__stream);
    }
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlShellWrite(xmlShellCtxtPtr ctxt, char *filename, xmlNodePtr node,
              xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    if (node == NULL)
        return (-1);
    if ((filename == NULL) || (filename[0] == 0)) {
        return (-1);
    }
#ifdef W_OK
    if (access((char *) filename, W_OK)) {
        xmlGenericError(xmlGenericErrorContext,
                        "Cannot write to %s\n", filename);
        return (-1);
    }
#endif
    switch (node->type) {
        case XML_DOCUMENT_NODE:
            if (xmlSaveFile((char *) filename, ctxt->doc) < -1) {
                xmlGenericError(xmlGenericErrorContext,
                                "Failed to write to %s\n", filename);
                return (-1);
            }
            break;
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_HTML_ENABLED
            if (htmlSaveFile((char *) filename, ctxt->doc) < 0) {
                xmlGenericError(xmlGenericErrorContext,
                                "Failed to write to %s\n", filename);
                return (-1);
            }
#else
            if (xmlSaveFile((char *) filename, ctxt->doc) < -1) {
                xmlGenericError(xmlGenericErrorContext,
                                "Failed to write to %s\n", filename);
                return (-1);
            }
#endif /* LIBXML_HTML_ENABLED */
            break;
        default:{
                FILE *f;

                f = fopen((char *) filename, "w");
                if (f == NULL) {
                    xmlGenericError(xmlGenericErrorContext,
                                    "Failed to write to %s\n", filename);
                    return (-1);
                }
                xmlElemDump(f, ctxt->doc, node);
                fclose(f);
            }
    }
    return (0);
}